

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void print_options(void)

{
  long lVar1;
  nh_menuitem_conflict *pnVar2;
  nh_menuitem *_item__7;
  nh_menuitem *_item__6;
  nh_menuitem *_item__5;
  nh_menuitem *_item__4;
  nh_menuitem *_item__3;
  nh_menuitem *_item__2;
  nh_menuitem *_item__1;
  nh_menuitem *_item_;
  nh_option_desc *options;
  char buf [256];
  wchar_t local_1c;
  wchar_t local_18;
  wchar_t size;
  wchar_t icount;
  wchar_t i;
  nh_menuitem *items;
  
  _icount = (nh_menuitem_conflict *)malloc(0xa78);
  local_1c = L'\n';
  _icount->id = L'\0';
  _icount->role = MI_HEADING;
  _icount->accel = '\0';
  _icount->group_accel = '\0';
  _icount->selected = '\0';
  strcpy(_icount->caption,"Birth options:");
  local_18 = L'\x01';
  lVar1 = nh_get_options(0);
  size = L'\0';
  while (*(long *)(lVar1 + (long)size * 0x30) != 0) {
    snprintf((char *)&options,0x100,"%s\t%s",*(undefined8 *)(lVar1 + (long)size * 0x30),
             *(undefined8 *)(lVar1 + (long)size * 0x30 + 8));
    if (local_1c <= local_18) {
      local_1c = local_1c << 1;
      _icount = (nh_menuitem_conflict *)realloc(_icount,(long)local_1c * 0x10c);
    }
    pnVar2 = _icount + local_18;
    pnVar2->id = L'\0';
    pnVar2->role = MI_TEXT;
    pnVar2->accel = '\0';
    pnVar2->group_accel = '\0';
    pnVar2->selected = '\0';
    strcpy(pnVar2->caption,(char *)&options);
    local_18 = local_18 + L'\x01';
    size = size + L'\x01';
  }
  if (local_1c <= local_18) {
    local_1c = local_1c << 1;
    _icount = (nh_menuitem_conflict *)realloc(_icount,(long)local_1c * 0x10c);
  }
  pnVar2 = _icount + local_18;
  pnVar2->id = L'\0';
  pnVar2->role = MI_TEXT;
  pnVar2->accel = '\0';
  pnVar2->group_accel = '\0';
  pnVar2->selected = '\0';
  strcpy(pnVar2->caption,"");
  if (local_1c <= local_18 + L'\x01') {
    local_1c = local_1c << 1;
    _icount = (nh_menuitem_conflict *)realloc(_icount,(long)local_1c * 0x10c);
  }
  pnVar2 = _icount + (local_18 + L'\x01');
  pnVar2->id = L'\0';
  pnVar2->role = MI_HEADING;
  pnVar2->accel = '\0';
  pnVar2->group_accel = '\0';
  pnVar2->selected = '\0';
  strcpy(pnVar2->caption,"Game options:");
  local_18 = local_18 + L'\x02';
  lVar1 = nh_get_options(2);
  size = L'\0';
  while (*(long *)(lVar1 + (long)size * 0x30) != 0) {
    snprintf((char *)&options,0x100,"%s\t%s",*(undefined8 *)(lVar1 + (long)size * 0x30),
             *(undefined8 *)(lVar1 + (long)size * 0x30 + 8));
    if (local_1c <= local_18) {
      local_1c = local_1c << 1;
      _icount = (nh_menuitem_conflict *)realloc(_icount,(long)local_1c * 0x10c);
    }
    pnVar2 = _icount + local_18;
    pnVar2->id = L'\0';
    pnVar2->role = MI_TEXT;
    pnVar2->accel = '\0';
    pnVar2->group_accel = '\0';
    pnVar2->selected = '\0';
    strcpy(pnVar2->caption,(char *)&options);
    local_18 = local_18 + L'\x01';
    size = size + L'\x01';
  }
  if (local_1c <= local_18) {
    local_1c = local_1c << 1;
    _icount = (nh_menuitem_conflict *)realloc(_icount,(long)local_1c * 0x10c);
  }
  pnVar2 = _icount + local_18;
  pnVar2->id = L'\0';
  pnVar2->role = MI_TEXT;
  pnVar2->accel = '\0';
  pnVar2->group_accel = '\0';
  pnVar2->selected = '\0';
  strcpy(pnVar2->caption,"");
  if (local_1c <= local_18 + L'\x01') {
    local_1c = local_1c << 1;
    _icount = (nh_menuitem_conflict *)realloc(_icount,(long)local_1c * 0x10c);
  }
  pnVar2 = _icount + (local_18 + L'\x01');
  pnVar2->id = L'\0';
  pnVar2->role = MI_HEADING;
  pnVar2->accel = '\0';
  pnVar2->group_accel = '\0';
  pnVar2->selected = '\0';
  strcpy(pnVar2->caption,"Interface options:");
  local_18 = local_18 + L'\x02';
  size = L'\0';
  while (curses_options[size].name != (char *)0x0) {
    snprintf((char *)&options,0x100,"%s\t%s",curses_options[size].name,curses_options[size].helptxt)
    ;
    if (local_1c <= local_18) {
      local_1c = local_1c << 1;
      _icount = (nh_menuitem_conflict *)realloc(_icount,(long)local_1c * 0x10c);
    }
    pnVar2 = _icount + local_18;
    pnVar2->id = L'\0';
    pnVar2->role = MI_TEXT;
    pnVar2->accel = '\0';
    pnVar2->group_accel = '\0';
    pnVar2->selected = '\0';
    strcpy(pnVar2->caption,(char *)&options);
    local_18 = local_18 + L'\x01';
    size = size + L'\x01';
  }
  curses_display_menu(_icount,local_18,"Available options:",L'\0',(wchar_t *)0x0);
  free(_icount);
  return;
}

Assistant:

void print_options(void)
{
    struct nh_menuitem *items;
    int i, icount, size;
    char buf[BUFSZ];
    struct nh_option_desc *options;

    icount = 0; size = 10;
    items = malloc(sizeof(struct nh_menuitem) * size);
    
    add_menu_txt(items, size, icount, "Birth options:", MI_HEADING);
    options = nh_get_options(CURRENT_BIRTH_OPTIONS);
    for (i = 0; options[i].name; i++) {
	snprintf(buf, BUFSZ, "%s\t%s", options[i].name, options[i].helptxt);
	add_menu_txt(items, size, icount, buf, MI_TEXT);
    }
    add_menu_txt(items, size, icount, "", MI_TEXT);
    
    add_menu_txt(items, size, icount, "Game options:", MI_HEADING);
    options = nh_get_options(GAME_OPTIONS);
    for (i = 0; options[i].name; i++) {
	snprintf(buf, BUFSZ, "%s\t%s", options[i].name, options[i].helptxt);
	add_menu_txt(items, size, icount, buf, MI_TEXT);
    }
    add_menu_txt(items, size, icount, "", MI_TEXT);

    /* add UI specific options */
    add_menu_txt(items, size, icount, "Interface options:", MI_HEADING);
    for (i = 0; curses_options[i].name; i++) {
	snprintf(buf, BUFSZ, "%s\t%s", curses_options[i].name, curses_options[i].helptxt);
	add_menu_txt(items, size, icount, buf, MI_TEXT);
    }

    curses_display_menu(items, icount, "Available options:", PICK_NONE, NULL);
    free(items);
}